

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int lat_fwd_bwd(s3lattice_t *lat)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  s3arc_s *psVar4;
  uint uVar5;
  s3arc_s *psVar6;
  uint uVar7;
  float64 *pfVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  float64 fVar14;
  double dVar15;
  
  uVar7 = lat->n_arcs;
  if (uVar7 == 0) {
    lat->prob = -10000000000.0;
    lat->postprob = 0.0;
  }
  else {
    psVar6 = lat->arc;
    uVar11 = 0;
    psVar4 = psVar6;
    do {
      psVar4[uVar11].alpha = -10000000000.0;
      if (psVar4[uVar11].good_arc == 1) {
        dVar15 = (double)psVar4[uVar11].lm_score;
        dVar1 = (double)psVar4[uVar11].ac_score;
        dVar3 = (double)(float)lm_scale;
        if (psVar6[uVar11].n_prev_arcs != 0) {
          uVar10 = 0;
          do {
            if (psVar6[uVar11].prev_arcs[uVar10] == 0) {
              if (psVar6[uVar11].sf == 1) {
                uVar12 = SUB84(psVar6[uVar11].alpha,0);
                uVar13 = (undefined4)((ulong)psVar6[uVar11].alpha >> 0x20);
                fVar14 = 0.0;
                goto LAB_001098f0;
              }
            }
            else {
              uVar7 = psVar6[uVar11].prev_arcs[uVar10] - 1;
              if (psVar6[uVar7].good_arc == 1) {
                uVar12 = SUB84(psVar6[uVar11].alpha,0);
                uVar13 = (undefined4)((ulong)psVar6[uVar11].alpha >> 0x20);
                fVar14 = psVar6[uVar7].alpha;
LAB_001098f0:
                fVar14 = log_add((float64)CONCAT44(uVar13,uVar12),fVar14);
                psVar6 = lat->arc;
                psVar6[uVar11].alpha = fVar14;
              }
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < psVar6[uVar11].n_prev_arcs);
          uVar7 = lat->n_arcs;
        }
        psVar6[uVar11].alpha = (float64)(dVar15 + dVar1 / dVar3 + (double)psVar6[uVar11].alpha);
        psVar4 = psVar6;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar7);
    lat->prob = -10000000000.0;
    if (-1 < (int)(uVar7 - 1)) {
      uVar11 = (ulong)(uVar7 - 1);
      do {
        psVar6 = lat->arc;
        psVar6[uVar11].beta = -10000000000.0;
        if (psVar6[uVar11].good_arc == 1) {
          psVar4 = psVar6 + uVar11;
          dVar15 = (double)psVar4->lm_score;
          dVar1 = (double)psVar4->ac_score;
          dVar3 = (double)(float)lm_scale;
          if (psVar4->n_next_arcs != 0) {
            uVar10 = 0;
            do {
              if (psVar4->next_arcs[uVar10] == 0) {
                uVar12 = SUB84(psVar4->beta,0);
                uVar13 = (undefined4)((ulong)psVar4->beta >> 0x20);
                fVar14 = 0.0;
              }
              else {
                uVar12 = SUB84(psVar4->beta,0);
                uVar13 = (undefined4)((ulong)psVar4->beta >> 0x20);
                fVar14 = psVar6[psVar4->next_arcs[uVar10] - 1].beta;
              }
              fVar14 = log_add((float64)CONCAT44(uVar13,uVar12),fVar14);
              psVar6 = lat->arc;
              psVar4 = psVar6 + uVar11;
              psVar6[uVar11].beta = fVar14;
              uVar10 = uVar10 + 1;
            } while (uVar10 < psVar6[uVar11].n_next_arcs);
          }
          dVar15 = dVar15 + dVar1 / dVar3 + (double)psVar4->beta;
          psVar4->beta = (float64)dVar15;
          if (psVar4->sf == 1) {
            fVar14 = log_add(lat->prob,(float64)dVar15);
            lat->prob = fVar14;
          }
        }
        bVar2 = 0 < (long)uVar11;
        uVar11 = uVar11 - 1;
      } while (bVar2);
      uVar7 = lat->n_arcs;
    }
    if (uVar7 == 0) {
      uVar7 = 0;
    }
    else {
      dVar15 = (double)(float)lm_scale;
      psVar6 = lat->arc;
      lVar9 = 0;
      do {
        *(undefined8 *)((long)&psVar6->gamma + lVar9) = 0xc202a05f20000000;
        if (*(int *)((long)&psVar6->good_arc + lVar9) == 1) {
          *(double *)((long)&psVar6->gamma + lVar9) =
               (*(double *)((long)&psVar6->alpha + lVar9) + *(double *)((long)&psVar6->beta + lVar9)
               ) - (*(double *)((long)&psVar6->ac_score + lVar9) / dVar15 +
                    *(double *)((long)&psVar6->lm_score + lVar9) + (double)lat->prob);
        }
        lVar9 = lVar9 + 0xd8;
      } while ((ulong)uVar7 * 0xd8 - lVar9 != 0);
    }
    lat->postprob = 0.0;
    uVar5 = uVar7 - lat->n_true_arcs;
    if (uVar5 < uVar7) {
      pfVar8 = &lat->arc[(int)uVar5].gamma;
      dVar15 = 0.0;
      do {
        dVar15 = dVar15 + (double)*pfVar8;
        pfVar8 = pfVar8 + 0x1b;
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar7);
      lat->postprob = (float64)dVar15;
    }
  }
  return 0;
}

Assistant:

int
lat_fwd_bwd(s3lattice_t *lat)
{
  int i, j;
  uint32 id;
  float64 ac_score, lm_score;

  /* step forward */
  for (i=0; i<lat->n_arcs; i++) {
    /* initialise alpha */
    lat->arc[i].alpha = LOG_ZERO;
    if (lat->arc[i].good_arc == 1) {
      /* get the acoustic and lm socre for a word hypothesis */
      ac_score = lat->arc[i].ac_score / lm_scale;
      lm_score = lat->arc[i].lm_score;

      /* compute alpha */
      for (j=0; j<lat->arc[i].n_prev_arcs; j++) {
	id = lat->arc[i].prev_arcs[j];
	if (id == 0) {
	  if (lat->arc[i].sf == 1) {
	    lat->arc[i].alpha = log_add(lat->arc[i].alpha, 0);
	  }
	}
	else {
	  if (lat->arc[id-1].good_arc == 1)
	    lat->arc[i].alpha = log_add(lat->arc[i].alpha, lat->arc[id-1].alpha);
	}
      }
      lat->arc[i].alpha += ac_score + lm_score;
    }
  }

  /* initialise overall log-likelihood */
  lat->prob = LOG_ZERO;

  /* step backward */
  for (i=lat->n_arcs-1; i>=0 ;i--) {
    /* initialise beta */
    lat->arc[i].beta = LOG_ZERO;

    if (lat->arc[i].good_arc == 1) {
      /* get the acoustic and lm socre for a word hypothesis */
      ac_score = lat->arc[i].ac_score / lm_scale;
      lm_score = lat->arc[i].lm_score;

      /* compute beta */
      for (j=0; j<lat->arc[i].n_next_arcs; j++) {
	id = lat->arc[i].next_arcs[j];
	if (id == 0) {
	  lat->arc[i].beta = log_add(lat->arc[i].beta, 0);
	}
	else {
	  if (lat->arc[id-1].good_arc == 1)
        ;
	  lat->arc[i].beta = log_add(lat->arc[i].beta, lat->arc[id-1].beta);
	}
      }
      lat->arc[i].beta += ac_score + lm_score;

      /* compute overall log-likelihood loglid=beta(1)=alpha(Q) */
      if (lat->arc[i].sf == 1)
	lat->prob = log_add(lat->prob, lat->arc[i].beta);
    }
  }

  /* compute gamma */
  for (i=0; i<lat->n_arcs; i++)
    {
      /* initialise gamma */
      lat->arc[i].gamma = LOG_ZERO;
      if (lat->arc[i].good_arc == 1)
	{
	  ac_score = lat->arc[i].ac_score / lm_scale;
	  lm_score = lat->arc[i].lm_score;
	  lat->arc[i].gamma = lat->arc[i].alpha + lat->arc[i].beta - (ac_score + lm_score + lat->prob);
	}
    }

  /* compute the posterior probability of the true path */
  lat->postprob = 0;
  for (i=lat->n_arcs-lat->n_true_arcs; i<lat->n_arcs; i++)
    lat->postprob += lat->arc[i].gamma;
  
  return S3_SUCCESS;
}